

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_overflow.cpp
# Opt level: O1

int main(void)

{
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> v;
  allocator_type local_31;
  vector<int,_std::allocator<int>_> local_30;
  int local_18 [4];
  
  local_18[0] = 0xc;
  local_18[1] = 0x17;
  local_18[2] = 0x22;
  local_18[3] = 0x2d;
  __l._M_len = 4;
  __l._M_array = local_18;
  std::vector<int,_std::allocator<int>_>::vector(&local_30,__l,&local_31);
  std::vector<int,_std::allocator<int>_>::reserve(&local_30,8);
  local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[6]
       = 0;
  if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
  std::vector<int> v = { 12, 23, 34, 45 };
  v.reserve(8);
  v.data()[6] = 0;
}